

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
          (DepthStencilState *this,VkBool32 _depthTestEnable,VkBool32 _depthWriteEnable,
          VkCompareOp _depthCompareOp,VkBool32 _depthBoundsTestEnable,VkBool32 _stencilTestEnable,
          StencilOpState _front,StencilOpState _back,float _minDepthBounds,float _maxDepthBounds)

{
  float _maxDepthBounds_local;
  float _minDepthBounds_local;
  VkBool32 _stencilTestEnable_local;
  VkBool32 _depthBoundsTestEnable_local;
  VkCompareOp _depthCompareOp_local;
  VkBool32 _depthWriteEnable_local;
  VkBool32 _depthTestEnable_local;
  DepthStencilState *this_local;
  
  (this->super_VkPipelineDepthStencilStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  (this->super_VkPipelineDepthStencilStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineDepthStencilStateCreateInfo).flags = 0;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthTestEnable = _depthTestEnable;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthWriteEnable = _depthWriteEnable;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthCompareOp = _depthCompareOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthBoundsTestEnable = _depthBoundsTestEnable
  ;
  (this->super_VkPipelineDepthStencilStateCreateInfo).stencilTestEnable = _stencilTestEnable;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.failOp =
       _front.super_VkStencilOpState.failOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.passOp =
       _front.super_VkStencilOpState.passOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.depthFailOp =
       _front.super_VkStencilOpState.depthFailOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.compareOp =
       _front.super_VkStencilOpState.compareOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.compareMask =
       _front.super_VkStencilOpState.compareMask;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.writeMask =
       _front.super_VkStencilOpState.writeMask;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.reference =
       _front.super_VkStencilOpState.reference;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.failOp =
       _back.super_VkStencilOpState.failOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.passOp =
       _back.super_VkStencilOpState.passOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.depthFailOp =
       _back.super_VkStencilOpState.depthFailOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.compareOp =
       _back.super_VkStencilOpState.compareOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.compareMask =
       _back.super_VkStencilOpState.compareMask;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.writeMask =
       _back.super_VkStencilOpState.writeMask;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.reference =
       _back.super_VkStencilOpState.reference;
  (this->super_VkPipelineDepthStencilStateCreateInfo).minDepthBounds = _minDepthBounds;
  (this->super_VkPipelineDepthStencilStateCreateInfo).maxDepthBounds = _maxDepthBounds;
  return;
}

Assistant:

PipelineCreateInfo::DepthStencilState::DepthStencilState (vk::VkBool32		_depthTestEnable,
														  vk::VkBool32		_depthWriteEnable,
														  vk::VkCompareOp	_depthCompareOp,
														  vk::VkBool32		_depthBoundsTestEnable,
														  vk::VkBool32		_stencilTestEnable,
														  StencilOpState	_front,
														  StencilOpState	_back,
														  float				_minDepthBounds,
														  float				_maxDepthBounds)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
	pNext = DE_NULL;
	flags					= 0u;
	depthTestEnable			= _depthTestEnable;
	depthWriteEnable		= _depthWriteEnable;
	depthCompareOp			= _depthCompareOp;
	depthBoundsTestEnable	= _depthBoundsTestEnable;
	stencilTestEnable		= _stencilTestEnable;
	front	= _front;
	back	= _back;

	minDepthBounds = _minDepthBounds;
	maxDepthBounds = _maxDepthBounds;
}